

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

void tcu::astc::anon_unknown_0::computeColorEndpoints
               (ColorEndpointPair *dst,Block128 *blockData,deUint32 *endpointModes,int numPartitions
               ,int numColorEndpointValues,ISEParams *iseParams,int numBitsAvailable)

{
  int startNdxInSrc;
  deUint32 local_178 [2];
  deUint32 unquantizedEndpoints [18];
  BitAccessStream dataStream;
  ISEDecodedResult colorEndpointData [18];
  int colorEndpointDataStart;
  ISEParams *iseParams_local;
  int numColorEndpointValues_local;
  int numPartitions_local;
  deUint32 *endpointModes_local;
  Block128 *blockData_local;
  ColorEndpointPair *dst_local;
  
  startNdxInSrc = 0x1d;
  if (numPartitions == 1) {
    startNdxInSrc = 0x11;
  }
  BitAccessStream::BitAccessStream
            ((BitAccessStream *)(unquantizedEndpoints + 0x10),blockData,startNdxInSrc,
             numBitsAvailable,true);
  decodeISE((ISEDecodedResult *)&dataStream.m_forward,numColorEndpointValues,
            (BitAccessStream *)(unquantizedEndpoints + 0x10),iseParams);
  unquantizeColorEndpoints
            (local_178,(ISEDecodedResult *)&dataStream.m_forward,numColorEndpointValues,iseParams);
  decodeColorEndpoints(dst,local_178,endpointModes,numPartitions);
  return;
}

Assistant:

void computeColorEndpoints (ColorEndpointPair* dst, const Block128& blockData, const deUint32* endpointModes, int numPartitions, int numColorEndpointValues, const ISEParams& iseParams, int numBitsAvailable)
{
	const int			colorEndpointDataStart = numPartitions == 1 ? 17 : 29;
	ISEDecodedResult	colorEndpointData[18];

	{
		BitAccessStream dataStream(blockData, colorEndpointDataStart, numBitsAvailable, true);
		decodeISE(&colorEndpointData[0], numColorEndpointValues, dataStream, iseParams);
	}

	{
		deUint32 unquantizedEndpoints[18];
		unquantizeColorEndpoints(&unquantizedEndpoints[0], &colorEndpointData[0], numColorEndpointValues, iseParams);
		decodeColorEndpoints(dst, &unquantizedEndpoints[0], &endpointModes[0], numPartitions);
	}
}